

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O0

int searchAll48(uint64_t **seedbuf,uint64_t *buflen,char *path,int threads,uint64_t *lowBits,
               int lowBitN,_func_int_uint64_t_void_ptr *check,void *data,char *stop)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  uint64_t *puVar3;
  void *pvVar4;
  int in_ECX;
  char *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  linked_seeds_t *tmp;
  linked_seeds_t *lp_1;
  linked_seeds_t *lp;
  size_t n;
  char buffer [4097];
  FILE *fp_1;
  int64_t lentry;
  char buf [32];
  int nnl;
  int c;
  FILE *fp;
  char dpath [4096];
  size_t pathlen;
  int err;
  int t;
  int i;
  thread_id_t *tids;
  threadinfo_t *info;
  void *local_20c0;
  long local_20b8;
  undefined1 local_20a8 [8];
  uint64_t *in_stack_ffffffffffffdf60;
  char *in_stack_ffffffffffffdf68;
  char *in_stack_ffffffffffffdfe0;
  undefined8 local_1090;
  undefined1 local_1088 [32];
  uint local_1068;
  int local_1064;
  FILE *local_1060;
  char local_1058 [4096];
  size_t local_58;
  int local_4c;
  uint local_48;
  int local_44;
  void *local_40;
  void *local_38;
  undefined4 local_2c;
  undefined8 local_28;
  int local_1c;
  char *local_18;
  long *local_10;
  long *local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = malloc((long)in_ECX * 0x1370);
  local_40 = malloc((long)local_1c << 3);
  local_4c = 0;
  if (local_18 == (char *)0x0) {
    if ((local_8 != (long *)0x0) && (local_10 != (long *)0x0)) {
LAB_0013865f:
      for (local_48 = 0; (int)local_48 < local_1c; local_48 = local_48 + 1) {
        *(long *)((long)local_38 + (long)(int)local_48 * 0x1370) =
             ((long)(int)local_48 << 0x30) / (long)local_1c;
        *(long *)((long)local_38 + (long)(int)local_48 * 0x1370 + 8) =
             ((long)(int)(local_48 + 1) << 0x30) / (long)local_1c + -1;
        *(undefined8 *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x10) = local_28;
        *(undefined4 *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x18) = local_2c;
        *(undefined1 *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x1c) = 0;
        *(linked_seeds_t **)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x20) = lp_1;
        *(linked_seeds_t **)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x28) = lp;
        *(size_t *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x30) = n;
        if (local_18 == (char *)0x0) {
          *(undefined1 *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x38) = 0;
          *(undefined8 *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x1038) = 0;
        }
        else {
          snprintf((char *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x38),0x1000,"%s.part%d"
                   ,local_18,(ulong)local_48);
          local_1060 = fopen((char *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x38),"a+");
          if (local_1060 == (FILE *)0x0) goto LAB_00138f0d;
          local_1068 = 0;
          local_44 = 1;
          while ((((local_44 < 0x20 && (iVar1 = fseek(local_1060,(long)-local_44,2), iVar1 == 0)) &&
                  (local_1064 = fgetc(local_1060), 0 < local_1064)) &&
                 ((local_1068 == 0 || (local_1064 != 10))))) {
            local_1068 = local_1064 != 10 | local_1068;
            local_44 = local_44 + 1;
          }
          if (((local_44 < 0x20) && (iVar1 = fseek(local_1060,(long)(1 - local_44),2), iVar1 == 0))
             && ((sVar2 = fread(local_1088,(long)(local_44 + -1),1,local_1060), sVar2 != 0 &&
                 (iVar1 = __isoc99_sscanf(local_1088,"%ld",&local_1090), iVar1 == 1)))) {
            *(undefined8 *)((long)local_38 + (long)(int)local_48 * 0x1370) = local_1090;
            *(undefined1 *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x1c) = 1;
            printf("Continuing thread %d at seed %ld\n",(ulong)local_48,local_1090);
          }
          fseek(local_1060,0,2);
          *(FILE **)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x1038) = local_1060;
        }
      }
      for (local_48 = 0; (int)local_48 < local_1c; local_48 = local_48 + 1) {
        pthread_create((pthread_t *)((long)local_40 + (long)(int)local_48 * 8),(pthread_attr_t *)0x0
                       ,searchAll48Thread,(void *)((long)local_38 + (long)(int)local_48 * 0x1370));
      }
      for (local_48 = 0; (int)local_48 < local_1c; local_48 = local_48 + 1) {
        pthread_join(*(pthread_t *)((long)local_40 + (long)(int)local_48 * 8),(void **)0x0);
      }
      if ((n == 0) || (*(char *)n == '\0')) {
        if (local_18 == (char *)0x0) {
          *local_10 = 0;
          for (local_48 = 0; (int)local_48 < local_1c; local_48 = local_48 + 1) {
            local_20b8 = (long)local_38 + (long)(int)local_48 * 0x1370 + 0x1040;
            do {
              *local_10 = *(long *)(local_20b8 + 800) + *local_10;
              local_20b8 = *(long *)(local_20b8 + 0x328);
            } while (local_20b8 != 0);
          }
          pvVar4 = malloc(*local_10 << 3);
          *local_8 = (long)pvVar4;
          if (*local_8 == 0) {
            exit(1);
          }
          local_44 = 0;
          for (local_48 = 0; (int)local_48 < local_1c; local_48 = local_48 + 1) {
            local_20c0 = (void *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x1040);
            do {
              memcpy((void *)(*local_8 + (long)local_44 * 8),local_20c0,
                     *(long *)((long)local_20c0 + 800) << 3);
              local_44 = local_44 + (int)*(undefined8 *)((long)local_20c0 + 800);
              pvVar4 = *(void **)((long)local_20c0 + 0x328);
              if (local_20c0 != (void *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x1040)) {
                free(local_20c0);
              }
              local_20c0 = pvVar4;
            } while (pvVar4 != (void *)0x0);
          }
          goto LAB_00138f18;
        }
        __stream = fopen(local_18,"w");
        if (__stream != (FILE *)0x0) {
          for (local_48 = 0; (int)local_48 < local_1c; local_48 = local_48 + 1) {
            rewind(*(FILE **)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x1038));
            while (sVar2 = fread(local_20a8,1,0x1000,
                                 *(FILE **)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x1038))
                  , sVar2 != 0) {
              sVar2 = fwrite(local_20a8,1,sVar2,__stream);
              if (sVar2 == 0) {
                fclose(__stream);
                goto LAB_00138f0d;
              }
            }
            fclose(*(FILE **)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x1038));
            remove((char *)((long)local_38 + (long)(int)local_48 * 0x1370 + 0x38));
          }
          fclose(__stream);
          if ((local_8 != (long *)0x0) && (local_10 != (long *)0x0)) {
            puVar3 = loadSavedSeeds(in_stack_ffffffffffffdf68,in_stack_ffffffffffffdf60);
            *local_8 = (long)puVar3;
          }
          goto LAB_00138f18;
        }
      }
    }
  }
  else {
    local_58 = strlen(local_18);
    if (local_58 + 8 < 0x1000) {
      strcpy(local_1058,local_18);
      local_44 = (int)local_58;
      do {
        local_44 = local_44 + -1;
        if (local_44 < 0) goto LAB_0013865f;
      } while (local_1058[local_44] != '/');
      local_1058[local_44] = '\0';
      iVar1 = mkdirp(in_stack_ffffffffffffdfe0);
      if (iVar1 == 0) goto LAB_0013865f;
    }
  }
LAB_00138f0d:
  local_4c = 1;
LAB_00138f18:
  free(local_40);
  free(local_38);
  return local_4c;
}

Assistant:

int searchAll48(
        uint64_t **         seedbuf,
        uint64_t *          buflen,
        const char *        path,
        int                 threads,
        const uint64_t *    lowBits,
        int                 lowBitN,
        int (*check)(uint64_t s48, void *data),
        void *              data,
        volatile char *     stop
        )
{
    threadinfo_t *info = (threadinfo_t*) malloc(threads* sizeof(*info));
    thread_id_t *tids = (thread_id_t*) malloc(threads* sizeof(*tids));
    int i, t;
    int err = 0;

    if (path)
    {
        size_t pathlen = strlen(path);
        char dpath[MAX_PATHLEN];

        // split path into directory and file and create missing directories
        if (pathlen + 8 >= sizeof(dpath))
            goto L_err;
        strcpy(dpath, path);

        for (i = pathlen-1; i >= 0; i--)
        {
            if (IS_DIR_SEP(dpath[i]))
            {
                dpath[i] = 0;
                if (mkdirp(dpath))
                    goto L_err;
                break;
            }
        }
    }
    else if (seedbuf == NULL || buflen == NULL)
    {
        // no file and no buffer return: no output possible
        goto L_err;
    }

    // prepare the thread info and load progress if present
    for (t = 0; t < threads; t++)
    {
        info[t].start = (t * (MASK48+1) / threads);
        info[t].end = ((t+1) * (MASK48+1) / threads - 1);
        info[t].lowBits = lowBits;
        info[t].lowBitN = lowBitN;
        info[t].skipStart = 0;
        info[t].check = check;
        info[t].data = data;
        info[t].stop = stop;

        if (path)
        {
            // progress file of this thread
            snprintf(info[t].path, sizeof(info[t].path), "%s.part%d", path, t);
            FILE *fp = fopen(info[t].path, "a+");
            if (fp == NULL)
                goto L_err;

            int c, nnl = 0;
            char buf[32];

            // find the last newline
            for (i = 1; i < 32; i++)
            {
                if (fseek(fp, -i, SEEK_END)) break;
                c = fgetc(fp);
                if (c <= 0 || (nnl && c == '\n')) break;
                nnl |= (c != '\n');
            }

            if (i < 32 && !fseek(fp, 1-i, SEEK_END) && fread(buf, i-1, 1, fp) > 0)
            {
                // read the last entry, and replace the start seed accordingly
                int64_t lentry;
                if (sscanf(buf, "%" PRId64, &lentry) == 1)
                {
                    info[t].start = lentry;
                    info[t].skipStart = 1;
                    printf("Continuing thread %d at seed %" PRId64 "\n",
                        t, lentry);
                }
            }

            fseek(fp, 0, SEEK_END);
            info[t].fp = fp;
        }
        else
        {
            info[t].path[0] = 0;
            info[t].fp = NULL;
        }
    }


    // run the threads
#ifdef USE_PTHREAD

    for (t = 0; t < threads; t++)
    {
        pthread_create(&tids[t], NULL, searchAll48Thread, (void*)&info[t]);
    }

    for (t = 0; t < threads; t++)
    {
        pthread_join(tids[t], NULL);
    }

#else

    for (t = 0; t < threads; t++)
    {
        tids[t] = CreateThread(NULL, 0, searchAll48Thread,
            (LPVOID)&info[t], 0, NULL);
    }

    WaitForMultipleObjects(threads, tids, TRUE, INFINITE);

#endif

    if (stop && *stop)
        goto L_err;

    if (path)
    {
        // merge partial files
        FILE *fp = fopen(path, "w");
        if (fp == NULL)
            goto L_err;

        for (t = 0; t < threads; t++)
        {
            rewind(info[t].fp);

            char buffer[4097];
            size_t n;
            while ((n = fread(buffer, sizeof(char), 4096, info[t].fp)))
            {
                if (!fwrite(buffer, sizeof(char), n, fp))
                {
                    fclose(fp);
                    goto L_err;
                }
            }

            fclose(info[t].fp);
            remove(info[t].path);
        }

        fclose(fp);

        if (seedbuf && buflen)
        {
            *seedbuf = loadSavedSeeds(path, buflen);
        }
    }
    else
    {
        // merge linked seed buffers
        *buflen = 0;

        for (t = 0; t < threads; t++)
        {
            linked_seeds_t *lp = &info[t].ls;
            do
            {
                *buflen += lp->len;
                lp = lp->next;
            }
            while (lp);
        }

        *seedbuf = (uint64_t*) malloc((*buflen) * sizeof(uint64_t));
        if (*seedbuf == NULL)
            exit(1);

        i = 0;
        for (t = 0; t < threads; t++)
        {
            linked_seeds_t *lp = &info[t].ls;
            do
            {
                memcpy(*seedbuf + i, lp->seeds, lp->len * sizeof(uint64_t));
                i += lp->len;
                linked_seeds_t *tmp = lp;
                lp = lp->next;
                if (tmp != &info[t].ls)
                    free(tmp);
            }
            while (lp);
        }
    }

    if (0)
L_err:
        err = 1;

    free(tids);
    free(info);

    return err;
}